

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arduino.h
# Opt level: O2

void __thiscall SpyingSerial::clear(SpyingSerial *this)

{
  allocator<char> local_31;
  string local_30 [32];
  
  std::__cxx11::string::string<std::allocator<char>>(local_30,"",&local_31);
  std::__cxx11::stringbuf::str((string *)&this->field_0x18);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void clear() { log_.str(""); }